

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O0

void __thiscall OpenMD::SectionParserManager::~SectionParserManager(SectionParserManager *this)

{
  bool bVar1;
  pointer pSVar2;
  iterator i;
  list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
  *in_stack_ffffffffffffffc8;
  SectionParser *in_stack_ffffffffffffffd0;
  _Self local_20;
  _List_node_base *local_18;
  _List_iterator<OpenMD::SectionParserContext> local_10 [2];
  
  std::_List_iterator<OpenMD::SectionParserContext>::_List_iterator(local_10);
  local_18 = (_List_node_base *)
             std::__cxx11::
             list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
             begin(in_stack_ffffffffffffffc8);
  local_10[0]._M_node = local_18;
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::end
                   (in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_10,&local_20);
    if (!bVar1) break;
    pSVar2 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                       ((_List_iterator<OpenMD::SectionParserContext> *)0x24ba6c);
    in_stack_ffffffffffffffd0 = pSVar2->sectionParser;
    if (in_stack_ffffffffffffffd0 != (SectionParser *)0x0) {
      (*in_stack_ffffffffffffffd0->_vptr_SectionParser[1])();
    }
    std::_List_iterator<OpenMD::SectionParserContext>::operator++(local_10);
  }
  std::__cxx11::list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
  clear((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_> *)
        in_stack_ffffffffffffffd0);
  std::__cxx11::list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
  ~list((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_> *)
        0x24bab0);
  return;
}

Assistant:

SectionParserManager::~SectionParserManager() {
    SectionParserManager::iterator i;
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      delete (i->sectionParser);
    }
    sectionParsers_.clear();
  }